

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::AnyMetadata::PackFrom
          (AnyMetadata *this,Message *message,string *type_url_prefix)

{
  ArenaStringPtr *pAVar1;
  size_type sVar2;
  pointer pcVar3;
  int iVar4;
  undefined4 extraout_var;
  long *plVar5;
  size_type *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pAVar1 = this->type_url_;
  if (empty_string_once_init_ != 2) {
    local_70._0_8_ = &PTR__FunctionClosure0_0072ead0;
    local_70._8_8_ = InitEmptyString;
    local_70[0x10] = false;
    GoogleOnceInitImpl(&empty_string_once_init_,(Closure *)local_70);
    FunctionClosure0::~FunctionClosure0((FunctionClosure0 *)local_70);
  }
  iVar4 = (*(message->super_MessageLite)._vptr_MessageLite[0x17])(message);
  sVar2 = type_url_prefix->_M_string_length;
  if ((sVar2 == 0) || ((type_url_prefix->_M_dataplus)._M_p[sVar2 - 1] != '/')) {
    pcVar3 = (type_url_prefix->_M_dataplus)._M_p;
    local_70._0_8_ = local_70 + 0x10;
    std::__cxx11::string::_M_construct<char*>((string *)local_70,pcVar3,pcVar3 + sVar2);
    std::__cxx11::string::append((char *)local_70);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               (local_70,**(ulong **)(CONCAT44(extraout_var,iVar4) + 8));
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_50.field_2._M_allocated_capacity = *psVar6;
      local_50.field_2._8_8_ = plVar5[3];
    }
    else {
      local_50.field_2._M_allocated_capacity = *psVar6;
      local_50._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_50._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
      operator_delete((void *)local_70._0_8_,CONCAT71(local_70._17_7_,local_70[0x10]) + 1);
    }
  }
  else {
    std::operator+(&local_50,type_url_prefix,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (CONCAT44(extraout_var,iVar4) + 8));
  }
  ArenaStringPtr::SetNoArena(pAVar1,(string *)&fixed_address_empty_string_abi_cxx11_,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pAVar1 = this->value_;
  if (pAVar1->ptr_ == (string *)&fixed_address_empty_string_abi_cxx11_) {
    ArenaStringPtr::CreateInstanceNoArena(pAVar1,(string *)&fixed_address_empty_string_abi_cxx11_);
  }
  MessageLite::SerializeToString(&message->super_MessageLite,pAVar1->ptr_);
  return;
}

Assistant:

void AnyMetadata::PackFrom(const Message& message,
                           const string& type_url_prefix) {
  type_url_->SetNoArena(&::google::protobuf::internal::GetEmptyString(),
                        GetTypeUrl(message.GetDescriptor(), type_url_prefix));
  message.SerializeToString(value_->MutableNoArena(
      &::google::protobuf::internal::GetEmptyStringAlreadyInited()));
}